

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O1

void If_DsdManTune(If_DsdMan_t *p,int LutSize,int fFast,int fAdd,int fSpec,int fVerbose)

{
  uint *puVar1;
  void *pvVar2;
  word *pRes;
  uint uVar3;
  long lVar4;
  Vec_Int_t *vLits;
  int *piVar5;
  void *pSat;
  ProgressBar *p_00;
  int iDsd;
  uint nVars;
  
  if ((LutSize == 0 || fAdd == 0) && (0 < (p->vObjs).nSize)) {
    lVar4 = 0;
    do {
      puVar1 = (uint *)((long)(p->vObjs).pArray[lVar4] + 4);
      *puVar1 = *puVar1 & 0xfffffeff;
      lVar4 = lVar4 + 1;
    } while (lVar4 < (p->vObjs).nSize);
  }
  if (LutSize != 0) {
    vLits = (Vec_Int_t *)malloc(0x10);
    vLits->nCap = 1000;
    vLits->nSize = 0;
    piVar5 = (int *)malloc(4000);
    vLits->pArray = piVar5;
    pSat = If_ManSatBuildXY(LutSize);
    p_00 = Extra_ProgressBarStart(_stdout,(p->vObjs).nSize);
    if (0 < (p->vObjs).nSize) {
      iDsd = 0;
      lVar4 = 0;
      do {
        pvVar2 = (p->vObjs).pArray[lVar4];
        if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= lVar4)) {
          Extra_ProgressBarUpdate_int(p_00,(int)lVar4,(char *)0x0);
        }
        uVar3 = *(uint *)((long)pvVar2 + 4);
        nVars = uVar3 >> 3 & 0x1f;
        if ((LutSize < (int)nVars) && ((fAdd == 0 || ((uVar3 & 0x100) != 0)))) {
          *(uint *)((long)pvVar2 + 4) = uVar3 & 0xfffffeff;
          uVar3 = If_DsdManCheckXY_int(p,iDsd,LutSize,0,0,0);
          if (uVar3 == 0) {
            if (fFast == 0) {
              pRes = p->pTtElems[0xc];
              If_DsdManComputeTruthPtr(p,iDsd,(uchar *)0x0,pRes);
              uVar3 = If_ManSatCheckXYall(pSat,LutSize,pRes,nVars,vLits);
              if (uVar3 != 0) goto LAB_003a869a;
            }
            if ((p->vObjs).nSize <= lVar4) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            puVar1 = (uint *)((long)(p->vObjs).pArray[lVar4] + 4);
            *puVar1 = *puVar1 | 0x100;
          }
        }
LAB_003a869a:
        lVar4 = lVar4 + 1;
        iDsd = iDsd + 2;
      } while (lVar4 < (p->vObjs).nSize);
    }
    Extra_ProgressBarStop(p_00);
    If_ManSatUnbuild(pSat);
    if (vLits->pArray != (int *)0x0) {
      free(vLits->pArray);
      vLits->pArray = (int *)0x0;
    }
    free(vLits);
    if (fVerbose != 0) {
      If_DsdManPrintDistrib(p);
      return;
    }
  }
  return;
}

Assistant:

void If_DsdManTune( If_DsdMan_t * p, int LutSize, int fFast, int fAdd, int fSpec, int fVerbose )
{
    ProgressBar * pProgress = NULL;
    sat_solver * pSat = NULL;
    If_DsdObj_t * pObj;
    Vec_Int_t * vLits;
    int i, Value, nVars;
    word * pTruth;
    if ( !fAdd || !LutSize )
        If_DsdVecForEachObj( &p->vObjs, pObj, i )
            pObj->fMark = 0;
    if ( LutSize == 0 )
        return;
    vLits = Vec_IntAlloc( 1000 );
    pSat = (sat_solver *)If_ManSatBuildXY( LutSize );
    pProgress = Extra_ProgressBarStart( stdout, Vec_PtrSize(&p->vObjs) );
    If_DsdVecForEachObj( &p->vObjs, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        nVars = If_DsdObjSuppSize(pObj);
        if ( nVars <= LutSize )
            continue;
        if ( fAdd && !pObj->fMark )
            continue;
        pObj->fMark = 0;
        if ( If_DsdManCheckXY(p, Abc_Var2Lit(i, 0), LutSize, 0, 0, 0, 0) )
            continue;
        if ( fFast )
            Value = 0;
        else
        {
            pTruth = If_DsdManComputeTruth( p, Abc_Var2Lit(i, 0), NULL );
            Value = If_ManSatCheckXYall( pSat, LutSize, pTruth, nVars, vLits );
        }
        if ( Value )
            continue;
        If_DsdVecObjSetMark( &p->vObjs, i );
    }
    Extra_ProgressBarStop( pProgress );
    If_ManSatUnbuild( pSat );
    Vec_IntFree( vLits );
    if ( fVerbose )
        If_DsdManPrintDistrib( p );
}